

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamclient.cpp
# Opt level: O0

int __thiscall
hbm::streaming::StreamClient::processStreamMetaInformation
          (StreamClient *this,string *method,Value *params)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  reference sout;
  char *__s1;
  ulong uVar4;
  Value *pVVar5;
  Value *in_RSI;
  long in_RDI;
  runtime_error *e;
  Value *element;
  ValueConstIterator iter;
  Value *commandInterfaces;
  Value *in_stack_fffffffffffffdc8;
  Value *in_stack_fffffffffffffdd0;
  StreamClient *in_stack_fffffffffffffdd8;
  function<void_(hbm::streaming::StreamClient_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_&)>
  *in_stack_fffffffffffffde0;
  Value *in_stack_fffffffffffffde8;
  Value *in_stack_fffffffffffffe28;
  ostream *in_stack_fffffffffffffe30;
  string local_140 [32];
  undefined1 local_120 [64];
  string local_e0 [24];
  Value *in_stack_ffffffffffffff38;
  timeInfo *in_stack_ffffffffffffff40;
  string local_50 [56];
  
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_fffffffffffffdd0,(char *)in_stack_fffffffffffffdc8);
  if (bVar1) {
    Json::Value::operator[](in_stack_fffffffffffffde8,(char *)in_stack_fffffffffffffde0);
    Json::Value::asString_abi_cxx11_(in_RSI);
    std::__cxx11::string::operator=((string *)(in_RDI + 0x40060),local_50);
    std::__cxx11::string::~string(local_50);
    poVar3 = std::operator<<((ostream *)&std::cout,(string *)(in_RDI + 0x40020));
    poVar3 = std::operator<<(poVar3,": this is ");
    poVar3 = std::operator<<(poVar3,(string *)(in_RDI + 0x40060));
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<((ostream *)&std::cout,(string *)(in_RDI + 0x40020));
    std::operator<<(poVar3,": supported features: ");
    Json::Value::operator[](in_stack_fffffffffffffde8,(char *)in_stack_fffffffffffffde0);
    poVar3 = Json::operator<<(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    Json::Value::operator[](in_stack_fffffffffffffde8,(char *)in_stack_fffffffffffffde0);
    Json::Value::begin(in_stack_fffffffffffffdd0);
    while( true ) {
      Json::Value::end(in_stack_fffffffffffffdd0);
      bVar1 = Json::ValueIteratorBase::operator!=
                        ((ValueIteratorBase *)in_stack_fffffffffffffdd0,
                         (SelfType *)in_stack_fffffffffffffdc8);
      if (!bVar1) break;
      sout = Json::ValueConstIterator::operator*((ValueConstIterator *)0x138e22);
      pVVar5 = (Value *)std::operator<<((ostream *)&std::cout,(string *)(in_RDI + 0x40020));
      std::operator<<((ostream *)pVVar5,": command interfaces: ");
      poVar3 = Json::operator<<((ostream *)sout,pVVar5);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      Json::Value::operator[](in_stack_fffffffffffffde8,(char *)in_stack_fffffffffffffde0);
      Json::Value::asString_abi_cxx11_(in_RSI);
      __s1 = (char *)std::__cxx11::string::c_str();
      iVar2 = strncasecmp(__s1,"post",5);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff40);
      if (iVar2 == 0) {
        Json::Value::operator[](in_stack_fffffffffffffde8,(char *)in_stack_fffffffffffffde0);
        Json::Value::asString_abi_cxx11_(in_RSI);
        std::__cxx11::string::operator=((string *)(in_RDI + 0x40040),local_e0);
        std::__cxx11::string::~string(local_e0);
      }
      uVar4 = std::__cxx11::string::empty();
      if ((uVar4 & 1) != 0) {
        Json::Value::operator[](in_stack_fffffffffffffde8,(char *)in_stack_fffffffffffffde0);
        Json::Value::asString_abi_cxx11_(in_RSI);
        std::__cxx11::string::operator=((string *)(in_RDI + 0x400a0),(string *)(local_120 + 0x20));
        std::__cxx11::string::~string((string *)(local_120 + 0x20));
      }
      Json::ValueConstIterator::operator++((ValueConstIterator *)in_stack_fffffffffffffdd0);
    }
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffffdd0,(char *)in_stack_fffffffffffffdc8);
    if (bVar1) {
      in_stack_fffffffffffffde0 =
           (function<void_(hbm::streaming::StreamClient_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_&)>
            *)(in_RDI + 0x400c0);
      pVVar5 = Json::Value::operator[](in_stack_fffffffffffffde8,(char *)in_stack_fffffffffffffde0);
      timeInfo::set(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
      in_stack_fffffffffffffdd8 =
           (StreamClient *)Json::Value::operator[](pVVar5,(char *)in_stack_fffffffffffffde0);
      Json::Value::asString_abi_cxx11_(in_RSI);
      in_stack_fffffffffffffdc8 = (Value *)local_120;
      std::__cxx11::string::operator=
                ((string *)(in_RDI + 0x400f8),(string *)in_stack_fffffffffffffdc8);
      std::__cxx11::string::~string((string *)in_stack_fffffffffffffdc8);
      in_stack_fffffffffffffdd0 = Json::Value::operator[](pVVar5,(char *)in_stack_fffffffffffffde0);
      Json::Value::asString_abi_cxx11_(in_RSI);
      std::__cxx11::string::operator=((string *)(in_RDI + 0x400d8),local_140);
      std::__cxx11::string::~string(local_140);
    }
  }
  bVar1 = std::function::operator_cast_to_bool
                    ((function<void_(hbm::streaming::StreamClient_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_&)>
                      *)in_stack_fffffffffffffdd0);
  if (bVar1) {
    std::
    function<void_(hbm::streaming::StreamClient_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_&)>
    ::operator()(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
  }
  return 0;
}

Assistant:

int StreamClient::processStreamMetaInformation(const std::string& method, const Json::Value& params)
		{
			try {
				// stream related meta information
				if (method == "init") {
					// this gives important information needed to control the daq stream.
					m_streamId = params["streamId"].asString();
					std::cout << m_address << ": this is " << m_streamId << std::endl;
					std::cout << m_address << ": supported features: " << params["supported"] << std::endl;
					const Json::Value& commandInterfaces = params["commandInterfaces"];
					for (Json::ValueConstIterator iter = commandInterfaces.begin(); iter!= commandInterfaces.end(); ++iter) {
						const Json::Value& element = *iter;
						std::cout << m_address << ": command interfaces: " << element << std::endl;
						static const char POST[] = "post";
						if (strncasecmp(element["httpMethod"].asString().c_str(), POST, sizeof(POST)) == 0) {
							m_httpPath = element["httpPath"].asString();
						}
						
						// do not overwrite if control port is already set.
						// important for devices behind NAT router
						if (m_controlPort.empty()) {
							m_controlPort = element["port"].asString();
						}
					}
				} else if (method == "time") {
					m_initialTime.set(params["stamp"]);
					m_initialTimeEpoch = params["epoch"].asString();
					m_initialTimeScale = params["scale"].asString();
				}
				if(m_streamMetaCb) {
					m_streamMetaCb(*this, method, params);
				}

				return 0;
			} catch(const std::runtime_error& e) {
				std::cerr << e.what();
				return -1;
			}
		}